

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O2

void dumb_resample_get_current_sample_n_1_2
               (int n,DUMB_RESAMPLER *resampler,DUMB_VOLUME_RAMP_INFO *volume_left,
               DUMB_VOLUME_RAMP_INFO *volume_right,sample_t_conflict *dst)

{
  if (n == 0x10) {
    dumb_resample_get_current_sample_16_1_2(resampler,volume_left,volume_right,dst);
    return;
  }
  if (n == 8) {
    dumb_resample_get_current_sample_8_1_2(resampler,volume_left,volume_right,dst);
    return;
  }
  dumb_resample_get_current_sample_1_2(resampler,volume_left,volume_right,dst);
  return;
}

Assistant:

void dumb_resample_get_current_sample_n_1_2(int n, DUMB_RESAMPLER *resampler, DUMB_VOLUME_RAMP_INFO * volume_left, DUMB_VOLUME_RAMP_INFO * volume_right, sample_t *dst)
{
	if (n == 8)
		dumb_resample_get_current_sample_8_1_2(resampler, volume_left, volume_right, dst);
	else if (n == 16)
		dumb_resample_get_current_sample_16_1_2(resampler, volume_left, volume_right, dst);
	else
		dumb_resample_get_current_sample_1_2(resampler, volume_left, volume_right, dst);
}